

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Iscatter(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,int recvcount
                   ,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Iscatter();
  return iVar1;
}

Assistant:

int MPIABI_Iscatter(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Iscatter(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}